

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsDisassembler.c
# Opt level: O2

_Bool Mips_getInstruction(csh ud,uint8_t *code,size_t code_len,MCInst *instr,uint16_t *size,
                         uint64_t address)

{
  _Bool isBigEndian;
  uint feature;
  cs_detail *__s;
  DecodeStatus DVar1;
  cs_struct *handle;
  uint8_t *DecodeTable;
  MCRegisterInfo *in_stack_00000008;
  uint32_t Insn;
  uint32_t local_3c;
  uint16_t *local_38;
  
  if (code_len < 4) {
    return false;
  }
  feature = *(uint *)(ud + 4);
  isBigEndian = *(_Bool *)(ud + 0x28);
  __s = instr->flat_insn->detail;
  local_38 = size;
  if (__s != (cs_detail *)0x0) {
    memset(__s,0,0x5f8);
  }
  readInstruction32(code,&local_3c,isBigEndian,SUB41((feature & 0x10) >> 4,0));
  if ((feature & 0x10) == 0) {
    if ((~feature & 0xc0) == 0) {
      DVar1 = decodeInstruction(DecoderTableMips32r6_64r6_GP6432,instr,local_3c,address,
                                in_stack_00000008,feature);
      if (DVar1 != MCDisassembler_Fail) goto LAB_00181b8d;
LAB_00181b4f:
      DVar1 = decodeInstruction(DecoderTableMips32r6_64r632,instr,local_3c,address,in_stack_00000008
                                ,feature);
      if (DVar1 != MCDisassembler_Fail) goto LAB_00181b8d;
    }
    else if ((feature & 0x40) != 0) goto LAB_00181b4f;
    DecodeTable = DecoderTableMips32;
  }
  else {
    DecodeTable = DecoderTableMicroMips32;
  }
  DVar1 = decodeInstruction(DecodeTable,instr,local_3c,address,in_stack_00000008,feature);
  if (DVar1 == MCDisassembler_Fail) {
    return false;
  }
LAB_00181b8d:
  *local_38 = 4;
  return DVar1 == MCDisassembler_Success;
}

Assistant:

static DecodeStatus MipsDisassembler_getInstruction(int mode, MCInst *instr,
		const uint8_t *code, size_t code_len,
		uint16_t *Size,
		uint64_t Address, bool isBigEndian, MCRegisterInfo *MRI)
{
	uint32_t Insn;
	DecodeStatus Result;

	if (code_len < 4)
		// not enough data
		return MCDisassembler_Fail;

	if (instr->flat_insn->detail) {
		memset(instr->flat_insn->detail, 0, sizeof(cs_detail));
	}

	Result = readInstruction32((unsigned char*)code, &Insn, isBigEndian,
			mode & CS_MODE_MICRO);
	if (Result == MCDisassembler_Fail)
		return MCDisassembler_Fail;

	if (mode & CS_MODE_MICRO) {
		// Calling the auto-generated decoder function.
		Result = decodeInstruction(DecoderTableMicroMips32, instr, Insn, Address, MRI, mode);
		if (Result != MCDisassembler_Fail) {
			*Size = 4;
			return Result;
		}
		return MCDisassembler_Fail;
	}

#if 0
	// TODO: properly handle this in the future with MIPS1/2 modes
	if (((mode & CS_MODE_32) == 0) && ((mode & CS_MODE_MIPS3) == 0)) {	// COP3
		// DEBUG(dbgs() << "Trying COP3_ table (32-bit opcodes):\n");
		Result = decodeInstruction(DecoderTableCOP3_32, instr, Insn, Address, MRI, mode);
		if (Result != MCDisassembler_Fail) {
			*Size = 4;
			return Result;
		}
	}
#endif

	if (((mode & CS_MODE_MIPS32R6) != 0) && ((mode & CS_MODE_MIPSGP64) != 0)) {
		// DEBUG(dbgs() << "Trying Mips32r6_64r6 (GPR64) table (32-bit opcodes):\n");
		Result = decodeInstruction(DecoderTableMips32r6_64r6_GP6432, instr, Insn,
				Address, MRI, mode);
		if (Result != MCDisassembler_Fail) {
			*Size = 4;
			return Result;
		}
	}

	if ((mode & CS_MODE_MIPS32R6) != 0) {
		// DEBUG(dbgs() << "Trying Mips32r6_64r6 table (32-bit opcodes):\n");
		Result = decodeInstruction(DecoderTableMips32r6_64r632, instr, Insn,
				Address, MRI, mode);
		if (Result != MCDisassembler_Fail) {
			*Size = 4;
			return Result;
		}
	}

	// Calling the auto-generated decoder function.
	Result = decodeInstruction(DecoderTableMips32, instr, Insn, Address, MRI, mode);
	if (Result != MCDisassembler_Fail) {
		*Size = 4;
		return Result;
	}

	return MCDisassembler_Fail;
}